

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionEvaluation.hpp
# Opt level: O3

Option<Kernel::PolyNf> * __thiscall
Inferences::simplFloor<Kernel::NumTraits<Kernel::RealConstantType>>
          (Option<Kernel::PolyNf> *__return_storage_ptr__,Inferences *this,PolyNf *evalArgs)

{
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar1;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar2;
  Self SVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  RealConstantType *pRVar7;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Db_01;
  FuncId FVar11;
  FuncId f;
  anon_class_16_2_20c48a23 f_00;
  Numeral i;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> monom;
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  pulledOut;
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  keptIn;
  Numeral k;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  poly;
  Option<Kernel::RealConstantType> inner;
  int local_44c;
  RealConstantType local_448;
  _Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&>
  local_428;
  Value VStack_420;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_400;
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_3f8;
  PolyNf local_3e8;
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_3c8;
  OptionBase<Kernel::PolyNf> *local_3b8;
  ulong local_3b0;
  long local_3a8;
  undefined1 local_3a0 [16];
  RealConstantType local_390;
  undefined1 local_370 [16];
  int local_360;
  mp_limb_t *local_358;
  uint local_350 [2];
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_348;
  Lib local_340 [16];
  RealConstantType local_330;
  uint local_310;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_308;
  RealConstantType local_300;
  uint local_2e0;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_2d8;
  RealConstantType local_2d0;
  uint local_2b0;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_2a8;
  undefined1 local_2a0 [24];
  undefined8 *local_288;
  RealConstantType local_270;
  RealConstantType local_250;
  RealConstantType local_230;
  RealConstantType local_210;
  RealConstantType local_1f0;
  RealConstantType local_1d0;
  RealConstantType local_1b0;
  RealConstantType local_190;
  RealConstantType local_170;
  uint local_150;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_148;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_140;
  Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> local_120;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_110;
  undefined1 local_f0 [32];
  long local_d0;
  undefined8 *local_c8;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> local_b0;
  OptionBase<Kernel::RealConstantType> local_80;
  AnyPoly local_58;
  AnyPoly local_44;
  
  local_428.
  super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
  ._M_head_impl =
       (_Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
        )local_2a0;
  VStack_420._0_8_ = &local_390;
  VStack_420.init.super_RationalConstantType._num._val[0]._mp_d = (mp_limb_t *)&local_448;
  f_00.this = (Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               *)this;
  f_00.fs_ = (tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:921:7)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:922:7)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&>
              *)&local_428;
  Lib::CoproductImpl::
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  ::
  switchN<Lib::Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>::match<Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::Variable)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::AnyPoly)_1_>(Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::Variable)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::AnyPoly)_1_)const&::_lambda(auto:1)_1_>
            ((ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict26
              *)&local_80,
             (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              *)this,f_00);
  if (local_80._isSome == true) {
    Kernel::RationalConstantType::floor
              ((RationalConstantType *)local_370,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)
              );
    Kernel::RealConstantType::RealConstantType(&local_190,(IntegerConstantType *)local_370);
    Kernel::PolyNf::fromNumeral<Kernel::RealConstantType>((PolyNf *)&local_428,&local_190);
    Lib::OptionBase<Kernel::PolyNf>::OptionBase
              (&__return_storage_ptr__->super_OptionBase<Kernel::PolyNf>,(PolyNf *)&local_428);
    mpz_clear(local_190.super_RationalConstantType._den._val);
    mpz_clear((__mpz_struct *)&local_190);
    mpz_clear((__mpz_struct *)local_370);
    goto LAB_005004dc;
  }
  Kernel::PolyNf::wrapPoly<Kernel::NumTraits<Kernel::RealConstantType>>((PolyNf *)local_2a0);
  Lib::
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_3f8);
  local_3b8 = &__return_storage_ptr__->super_OptionBase<Kernel::PolyNf>;
  Lib::
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_3c8);
  pRVar7 = *(RealConstantType **)(local_2a0._8_8_ + 8);
  local_3a8 = local_2a0._8_8_;
  lVar6 = *(long *)(local_2a0._8_8_ + 0x10) - (long)pRVar7;
  if (pRVar7 != (RealConstantType *)0x0 && lVar6 != 0) {
    local_3b0 = (lVar6 >> 4) * -0x5555555555555555;
    uVar5 = 1;
    while( true ) {
      Kernel::RealConstantType::RealConstantType((RealConstantType *)&local_428,pRVar7);
      VStack_420._24_4_ = pRVar7[1].super_RationalConstantType._num._val[0]._mp_alloc;
      local_400 = (MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                  pRVar7[1].super_RationalConstantType._num._val[0]._mp_d;
      Kernel::RealConstantType::RealConstantType(&local_390,(RealConstantType *)&local_428);
      pMVar1 = local_400;
      uVar9 = VStack_420._24_4_;
      local_448.super_RationalConstantType._den._val[0]._mp_d =
           (mp_limb_t *)
           (((long)(local_400->_factors)._cursor - (long)(local_400->_factors)._stack >> 2) *
           0x6db6db6db6db6db7);
      local_448.super_RationalConstantType._num._val[0]._mp_d._0_1_ = 0;
      local_448.super_RationalConstantType._num._val[0]._mp_d._1_1_ = 0;
      local_448.super_RationalConstantType._num._val[0]._mp_d._2_6_ = 0;
      local_448.super_RationalConstantType._den._val[0]._mp_alloc._0_1_ = 0;
      local_448.super_RationalConstantType._den._val[0]._mp_alloc._1_1_ = 0;
      local_448.super_RationalConstantType._den._val[0]._2_6_ = 0;
      local_448.super_RationalConstantType._num._val[0]._0_8_ = local_400;
      bVar4 = Lib::
              IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>const&>>
              ::
              all<Inferences::isInteger<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>const&)::_lambda(auto:1_const&)_1_>
                        ((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::_lambda(auto:1)_1_,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>const&>>
                          *)&local_448);
      SVar3._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
              )local_3c8._self;
      if (bVar4) {
        Kernel::RationalConstantType::floor
                  ((RationalConstantType *)local_f0,
                   (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        Kernel::RealConstantType::RealConstantType(&local_448,(IntegerConstantType *)local_f0);
        mpz_clear((__mpz_struct *)local_f0);
        Kernel::RealConstantType::RealConstantType(&local_1b0,&local_448);
        local_44c = 0;
        bVar4 = Kernel::operator!=(&local_1b0,&local_44c);
        mpz_clear(local_1b0.super_RationalConstantType._den._val);
        mpz_clear((__mpz_struct *)&local_1b0);
        SVar3._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
        .
        super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
                )local_3f8._self;
        if (bVar4) {
          Kernel::RealConstantType::RealConstantType(&local_1d0,&local_448);
          Kernel::RealConstantType::RealConstantType(&local_2d0,&local_1d0);
          local_2b0 = uVar9;
          local_2a8 = pMVar1;
          pMVar8 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                    ((long)SVar3._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                           ._M_head_impl + 0x10);
          if (pMVar8 == *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                         ((long)SVar3._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                .
                                super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                                ._M_head_impl + 0x18)) {
            Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::expand
                      ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                       SVar3._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                       ._M_head_impl);
            pMVar8 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                      ((long)SVar3._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             .
                             super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                             ._M_head_impl + 0x10);
          }
          Kernel::RealConstantType::RealConstantType(&pMVar8->numeral,&local_2d0);
          (pMVar8->factors)._id = local_2b0;
          (pMVar8->factors)._ptr = local_2a8;
          *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
           ((long)SVar3._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  .
                  super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                  ._M_head_impl + 0x10) =
               *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                ((long)SVar3._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                       ._M_head_impl + 0x10) + 1;
          mpz_clear(local_2d0.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_2d0);
          mpz_clear(local_1d0.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_1d0);
        }
        Kernel::RealConstantType::operator-(&local_1f0,&local_390,&local_448);
        local_44c = 0;
        bVar4 = Kernel::operator!=(&local_1f0,&local_44c);
        mpz_clear(local_1f0.super_RationalConstantType._den._val);
        mpz_clear((__mpz_struct *)&local_1f0);
        SVar3._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
        .
        super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
                )local_3c8._self;
        if (bVar4) {
          Kernel::RealConstantType::operator-(&local_210,&local_390,&local_448);
          Kernel::RealConstantType::RealConstantType(&local_300,&local_210);
          local_2e0 = uVar9;
          local_2d8 = pMVar1;
          pMVar8 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                    ((long)SVar3._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                           ._M_head_impl + 0x10);
          if (pMVar8 == *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                         ((long)SVar3._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                .
                                super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                                ._M_head_impl + 0x18)) {
            Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::expand
                      ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                       SVar3._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                       ._M_head_impl);
            pMVar8 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                      ((long)SVar3._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             .
                             super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                             ._M_head_impl + 0x10);
          }
          Kernel::RealConstantType::RealConstantType(&pMVar8->numeral,&local_300);
          (pMVar8->factors)._id = local_2e0;
          (pMVar8->factors)._ptr = local_2d8;
          *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
           ((long)SVar3._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  .
                  super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                  ._M_head_impl + 0x10) =
               *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                ((long)SVar3._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                       ._M_head_impl + 0x10) + 1;
          mpz_clear(local_300.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_300);
          mpz_clear(local_210.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_210);
        }
        mpz_clear(local_448.super_RationalConstantType._den._val);
        mpz_clear((__mpz_struct *)&local_448);
      }
      else {
        Kernel::RealConstantType::RealConstantType(&local_330,(RealConstantType *)&local_428);
        local_310 = VStack_420._24_4_;
        local_308 = local_400;
        pMVar8 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                  ((long)SVar3._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                         ._M_head_impl + 0x10);
        if (pMVar8 == *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                       ((long)SVar3._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                              .
                              super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                              ._M_head_impl + 0x18)) {
          Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::expand
                    ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                     SVar3._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                     ._M_head_impl);
          pMVar8 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                    ((long)SVar3._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                           ._M_head_impl + 0x10);
        }
        Kernel::RealConstantType::RealConstantType(&pMVar8->numeral,&local_330);
        (pMVar8->factors)._id = local_310;
        (pMVar8->factors)._ptr = local_308;
        *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
         ((long)SVar3._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                ._M_head_impl + 0x10) =
             *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
              ((long)SVar3._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                     ._M_head_impl + 0x10) + 1;
        mpz_clear(local_330.super_RationalConstantType._den._val);
        mpz_clear((__mpz_struct *)&local_330);
      }
      mpz_clear(local_390.super_RationalConstantType._den._val);
      mpz_clear((__mpz_struct *)&local_390);
      mpz_clear((__mpz_struct *)((long)&VStack_420 + 8));
      mpz_clear((__mpz_struct *)&local_428);
      if (local_3b0 <= uVar5) break;
      pRVar7 = (RealConstantType *)(uVar5 * 0x30 + *(long *)(local_3a8 + 8));
      uVar5 = uVar5 + 1;
    }
  }
  __return_storage_ptr__ = (Option<Kernel::PolyNf> *)local_3b8;
  if (*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
       ((long)local_3f8._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
              .
              super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
              ._M_head_impl + 0x10) ==
      *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
       ((long)local_3f8._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
              .
              super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
              ._M_head_impl + 8)) {
    *(undefined8 *)((long)&(local_3b8->_elem)._elem + 8) = 0;
    *(undefined8 *)((long)&(local_3b8->_elem)._elem + 0x10) = 0;
    *(undefined8 *)local_3b8 = 0;
    *(undefined8 *)((long)&(local_3b8->_elem)._elem + 4) = 0;
  }
  else {
    lVar6 = ((long)*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                    ((long)local_3c8._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                           ._M_head_impl + 0x10) -
             (long)*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                    ((long)local_3c8._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                           ._M_head_impl + 8) >> 4) * -0x5555555555555555;
    if (lVar6 != 0) {
      if (lVar6 == 1) {
        bVar4 = Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::isNumeral
                          (*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                            ((long)local_3c8._self._M_t.
                                   super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                   .
                                   super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                                   ._M_head_impl + 8));
        if (bVar4) {
          pMVar1 = ((*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                      ((long)local_3c8._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             .
                             super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                             ._M_head_impl + 8))->factors)._ptr;
          if ((pMVar1->_factors)._stack == (pMVar1->_factors)._cursor) {
            Lib::OptionBase<Kernel::RealConstantType>::OptionBase
                      ((OptionBase<Kernel::RealConstantType> *)&local_428,
                       &(*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                          ((long)local_3c8._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                 .
                                 super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                                 ._M_head_impl + 8))->numeral);
            uVar9 = extraout_XMM0_Da_01;
            uVar10 = extraout_XMM0_Db_01;
          }
          else {
            uVar9 = 0;
            uVar10 = 0;
            VStack_420.init.super_RationalConstantType._num._val[0]._mp_d = (mp_limb_t *)0x0;
            VStack_420._16_8_ = (mp_limb_t *)0x0;
            local_428.
            super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
            ._M_head_impl =
                 (_Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
                  )(anon_class_1_0_00000001 *)0x0;
            VStack_420._0_8_ = (anon_class_1_0_00000001 *)0x0;
            VStack_420.init.super_RationalConstantType._den._val[0]._mp_d = (mp_limb_t *)0x0;
          }
          Kernel::RationalConstantType::floor
                    ((RationalConstantType *)local_3a0,(double)CONCAT44(uVar10,uVar9));
          Kernel::RealConstantType::RealConstantType(&local_448,(IntegerConstantType *)local_3a0);
          mpz_clear((__mpz_struct *)local_3a0);
          Lib::OptionBase<Kernel::RealConstantType>::~OptionBase
                    ((OptionBase<Kernel::RealConstantType> *)&local_428);
          Kernel::RealConstantType::RealConstantType(&local_230,&local_448);
          local_428.
          super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
          ._M_head_impl =
               (_Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
                )((ulong)local_428.
                         super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
                         ._M_head_impl & 0xffffffff00000000);
          bVar4 = Kernel::operator!=(&local_230,(int *)&local_428);
          mpz_clear(local_230.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_230);
          SVar3._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
          .
          super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
          ._M_head_impl =
               local_3f8._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
               .
               super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
               ._M_head_impl;
          if (bVar4) {
            Kernel::RealConstantType::RealConstantType(&local_250,&local_448);
            Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom(&local_b0,&local_250)
            ;
            pMVar8 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                      ((long)SVar3._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             .
                             super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                             ._M_head_impl + 0x10);
            if (pMVar8 == *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                           ((long)SVar3._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                  .
                                  super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                                  ._M_head_impl + 0x18)) {
              Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::expand
                        ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                         SVar3._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                         ._M_head_impl);
              pMVar8 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                        ((long)SVar3._M_t.
                               super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                               .
                               super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                               ._M_head_impl + 0x10);
            }
            Kernel::RealConstantType::RealConstantType(&pMVar8->numeral,&local_b0.numeral);
            (pMVar8->factors)._id = local_b0.factors._id;
            (pMVar8->factors)._ptr = local_b0.factors._ptr;
            *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
             ((long)SVar3._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                    .
                    super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                    ._M_head_impl + 0x10) =
                 *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                  ((long)SVar3._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                         ._M_head_impl + 0x10) + 1;
            mpz_clear(local_b0.numeral.super_RationalConstantType._den._val);
            mpz_clear((__mpz_struct *)&local_b0);
            mpz_clear(local_250.super_RationalConstantType._den._val);
            mpz_clear((__mpz_struct *)&local_250);
          }
          mpz_clear(local_448.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_448);
          goto LAB_00500405;
        }
      }
      Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
                ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_110,
                 (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                 local_3c8._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                 .
                 super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                 ._M_head_impl);
      Lib::
      perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
                (local_340,(Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_110);
      local_44.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[4] = '\0';
      local_44.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[5] = '\0';
      local_44.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[6] = '\0';
      local_44.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[7] = '\0';
      local_44.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._17_3_ = 0;
      local_44.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._0_1_ = 2;
      local_44.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[0] = (char)local_340[0];
      local_44.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[1] = (char)local_340[1];
      local_44.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[2] = (char)local_340[2];
      local_44.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[3] = (char)local_340[3];
      local_44.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content._8_3_ = SUB83(local_340._8_8_,0);
      local_44.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content._11_5_ = SUB85(local_340._8_8_,3);
      Kernel::PolyNf::PolyNf((PolyNf *)&local_428,&local_44);
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_110);
      FVar11 = Kernel::FuncId::fromInterpretation(REAL_FLOOR);
      f._typeArgs = FVar11._typeArgs;
      f._4_4_ = 0;
      f._num = FVar11._num;
      Kernel::FuncTerm::FuncTerm((FuncTerm *)(local_f0 + 0x10),f,(PolyNf *)&local_428);
      Lib::perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>
                ((Lib *)&local_120,(FuncTerm *)(local_f0 + 0x10));
      Kernel::PolyNf::PolyNf((PolyNf *)&local_448,&local_120);
      if (local_c8 != (undefined8 *)0x0) {
        uVar5 = local_d0 * 0x18 + 0xfU & 0xfffffffffffffff0;
        if (uVar5 == 0) {
          *local_c8 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_c8;
        }
        else if (uVar5 < 0x11) {
          *local_c8 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_c8;
        }
        else if (uVar5 < 0x19) {
          *local_c8 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_c8;
        }
        else if (uVar5 < 0x21) {
          *local_c8 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_c8;
        }
        else if (uVar5 < 0x31) {
          *local_c8 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_c8;
        }
        else if (uVar5 < 0x41) {
          *local_c8 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_c8;
        }
        else {
          operator_delete(local_c8,0x10);
        }
      }
      SVar3._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
      ._M_head_impl =
           local_3f8._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
           .
           super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
           ._M_head_impl;
      Kernel::RealConstantType::RealConstantType(&local_270,1);
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[4] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[8] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[9] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[10] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0xb] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0xc] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0xd] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0xe] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0xf] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0x10] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0x11] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0x12] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0x13] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._21_3_ = 0;
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._0_1_ = (byte)local_448.super_RationalConstantType._num._val[0]._mp_alloc._0_1_ & 3;
      if ((local_448.super_RationalConstantType._num._val[0]._0_8_ & 3) == 0) {
        local_3e8.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content._0_4_ = local_448.super_RationalConstantType._num._val[0]._1_4_;
        local_3e8.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content._8_4_ =
             SUB74(CONCAT61(local_448.super_RationalConstantType._num._val[0]._mp_d._2_6_,
                            local_448.super_RationalConstantType._num._val[0]._mp_d._1_1_),0);
        local_3e8.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content._12_4_ =
             SUB84(CONCAT17((undefined1)local_448.super_RationalConstantType._den._val[0]._mp_alloc,
                            CONCAT61(local_448.super_RationalConstantType._num._val[0]._mp_d._2_6_,
                                     local_448.super_RationalConstantType._num._val[0]._mp_d._1_1_))
                   >> 0x20,0);
      }
      else if (local_3e8.super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._0_1_ == 1) {
        local_3e8.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content._0_4_ = local_448.super_RationalConstantType._num._val[0]._1_4_;
      }
      else {
        local_3e8.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content._0_4_ = local_448.super_RationalConstantType._num._val[0]._1_4_ & 0xffffff03;
        local_3e8.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[4] = local_448.super_RationalConstantType._num._val[0]._mp_size._1_1_;
        local_3e8.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content._9_3_ = SUB63(local_448.super_RationalConstantType._num._val[0]._mp_d._2_6_,0);
        local_3e8.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content._8_4_ =
             (uint)(uint3)local_3e8.super_PolyNfSuper._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                          .
                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                          ._content._9_3_ << 8;
        local_3e8.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content._12_4_ =
             SUB74(CONCAT16((undefined1)local_448.super_RationalConstantType._den._val[0]._mp_alloc,
                            local_448.super_RationalConstantType._num._val[0]._mp_d._2_6_) >> 0x18,0
                  );
        local_3e8.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content._17_3_ = 0;
        local_3e8.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x10] = local_448.super_RationalConstantType._den._val[0]._mp_alloc._1_1_;
      }
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[7] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[5] = '\0';
      local_3e8.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[6] = '\0';
      Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomFactors
                ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)(local_2a0 + 0x10),
                 &local_3e8);
      Lib::
      perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
                ((Lib *)local_350,
                 (MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)(local_2a0 + 0x10));
      Kernel::RealConstantType::RealConstantType(&local_170,&local_270);
      local_150 = local_350[0];
      local_148 = local_348;
      pMVar8 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                ((long)SVar3._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                       ._M_head_impl + 0x10);
      if (pMVar8 == *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                     ((long)SVar3._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                            .
                            super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                            ._M_head_impl + 0x18)) {
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::expand
                  ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                   SVar3._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                   .
                   super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                   ._M_head_impl);
        pMVar8 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                  ((long)SVar3._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                         ._M_head_impl + 0x10);
      }
      Kernel::RealConstantType::RealConstantType(&pMVar8->numeral,&local_170);
      (pMVar8->factors)._id = local_150;
      (pMVar8->factors)._ptr = local_148;
      *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
       ((long)SVar3._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
              .
              super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
              ._M_head_impl + 0x10) =
           *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
            ((long)SVar3._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                   .
                   super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                   ._M_head_impl + 0x10) + 1;
      mpz_clear(local_170.super_RationalConstantType._den._val);
      mpz_clear((__mpz_struct *)&local_170);
      if (local_288 != (undefined8 *)0x0) {
        uVar5 = local_2a0._16_8_ * 0x1c + 0xfU & 0xfffffffffffffff0;
        if (uVar5 == 0) {
          *local_288 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_288;
        }
        else if (uVar5 < 0x11) {
          *local_288 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_288;
        }
        else if (uVar5 < 0x19) {
          *local_288 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_288;
        }
        else if (uVar5 < 0x21) {
          *local_288 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_288;
        }
        else if (uVar5 < 0x31) {
          *local_288 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_288;
        }
        else if (uVar5 < 0x41) {
          *local_288 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_288;
        }
        else {
          operator_delete(local_288,0x10);
        }
      }
      mpz_clear(local_270.super_RationalConstantType._den._val);
      mpz_clear((__mpz_struct *)&local_270);
    }
LAB_00500405:
    pMVar8 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
              ((long)local_3f8._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                     ._M_head_impl + 8);
    pMVar2 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
              ((long)local_3f8._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                     ._M_head_impl + 0x10);
    if (pMVar8 != pMVar2) {
      uVar5 = ((long)pMVar2 - (long)pMVar8 >> 4) * -0x5555555555555555;
      lVar6 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pMVar8,pMVar2,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
                (pMVar8,pMVar2);
    }
    Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_140,
               (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
               local_3f8._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
               .
               super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
               ._M_head_impl);
    Lib::
    perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
              ((Lib *)&local_360,(Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_140
              );
    local_58.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[4] = '\0';
    local_58.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[5] = '\0';
    local_58.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[6] = '\0';
    local_58.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[7] = '\0';
    local_58.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._17_3_ = 0;
    local_58.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._0_1_ = 2;
    local_58.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[0] = (undefined1)local_360;
    local_58.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[1] = local_360._1_1_;
    local_58.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[2] = local_360._2_1_;
    local_58.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[3] = local_360._3_1_;
    local_58.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content._8_3_ = SUB83(local_358,0);
    local_58.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content._11_5_ = SUB85((ulong)local_358 >> 0x18,0);
    Kernel::PolyNf::PolyNf((PolyNf *)&local_428,&local_58);
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_140);
    Lib::OptionBase<Kernel::PolyNf>::OptionBase
              (&__return_storage_ptr__->super_OptionBase<Kernel::PolyNf>,(PolyNf *)&local_428);
  }
  Lib::
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_3c8);
  Lib::
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_3f8);
LAB_005004dc:
  Lib::OptionBase<Kernel::RealConstantType>::~OptionBase(&local_80);
  return (Option<Kernel::PolyNf> *)&__return_storage_ptr__->super_OptionBase<Kernel::PolyNf>;
}

Assistant:

inline Option<PolyNf> simplFloor(PolyNf* evalArgs)
{
  using Numeral = typename NumTraits::ConstantType;
  auto inner = evalArgs[0].tryNumeral<NumTraits>();
  if (inner) {
    return some(PolyNf::fromNumeral(Numeral(inner->floor())));
  }  else {
    auto poly = evalArgs[0].wrapPoly<NumTraits>();
    // floor(s1 + ... + sn + t1 + ... + tm) ===> s1 + ... + sn + floor(t1 + ... + tn)
    //                              pulledOut <--^^^^^^^^^^^^^         ^^^^^^^^^^^^^--> keptIn
    Recycled<Stack<Monom<NumTraits>>> pulledOut;
    Recycled<Stack<Monom<NumTraits>>> keptIn;
    for (auto monom : poly->iterSummands()) {
      auto k = monom.numeral;
      auto t = monom.factors;
      if (isInteger(*t)) {
        // floor(t + k t) ==> floor(t + (k - i) t) + i t
        //   where t is an integer and
        //         i = floor(k)
        auto i = Numeral(k.floor());
        if (i       != 0) { pulledOut->push(Monom(i   , t)); }
        if ((k - i) != 0) { keptIn->   push(Monom(k -i, t)); }
      } else {
        keptIn->push(monom);
      }
    }

    if (pulledOut->size() == 0) {
      return {};

    } else {


      if (keptIn->size() == 0) {

      } else if (keptIn->size() == 1 && (*keptIn)[0].isNumeral()) { 
        auto numFloor = Numeral((*keptIn)[0].tryNumeral()->floor());
        if (numFloor != 0)
          pulledOut->push(Monom<NumTraits>(numFloor));
      } else {
        auto innerSum = PolyNf(AnyPoly(perfect(Polynom<NumTraits>(std::move(*keptIn)))));
        auto floorTerm = PolyNf(perfect(FuncTerm(FuncId::fromInterpretation(NumTraits::floorI), &innerSum)));
        pulledOut->push(Monom<NumTraits>(Numeral(1), perfect(MonomFactors<NumTraits>(floorTerm))));
      }


      std::sort(pulledOut->begin(), pulledOut->end());

      auto out = PolyNf(AnyPoly(perfect(Polynom<NumTraits>(std::move(*pulledOut)))));
      return some(out);
    }
  }
}